

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holoPlay.cpp
# Opt level: O0

void __thiscall
vera::renderQuilt(vera *this,
                 function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
                 *_renderFnc,int _viewIndex,bool _justQuilt)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Camera *pCVar5;
  undefined4 extraout_var;
  Vbo *this_00;
  socklen_t __len;
  undefined7 in_register_00000009;
  int iVar6;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *__addr;
  uint32_t __fd;
  mat<4,_4,_float,_(glm::qualifier)0> local_134;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_91;
  string local_90;
  undefined1 local_6c [8];
  vec4 vp_1;
  vec4 vp;
  int y;
  int x;
  int viewIndex;
  int qs_viewHeight;
  int qs_viewWidth;
  GLint viewport [4];
  Camera *cam;
  bool _justQuilt_local;
  vera *pvStack_10;
  int _viewIndex_local;
  function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
  *_renderFnc_local;
  
  __fd = (uint32_t)_renderFnc;
  __len = (socklen_t)CONCAT71(in_register_00000009,_justQuilt);
  cam._3_1_ = (byte)_viewIndex & 1;
  cam._4_4_ = __fd;
  pvStack_10 = this;
  pCVar5 = getCamera();
  if (pCVar5 != (Camera *)0x0) {
    if ((cam._3_1_ & 1) == 0) {
      bVar1 = Fbo::isAllocated((Fbo *)quilt_fbo);
      __addr = extraout_RDX;
      if (!bVar1) {
        __len = 1;
        __fd = quilt;
        Fbo::allocate((Fbo *)quilt_fbo,quilt,DAT_007c4300,COLOR_TEXTURE_DEPTH_BUFFER,LINEAR,REPEAT,
                      true);
        __addr = extraout_RDX_00;
      }
      if ((pCVar5 != (Camera *)0x0) &&
         (iVar2 = (*(pCVar5->super_Node)._vptr_Node[0x4a])(), __addr = extraout_RDX_01,
         *(int *)CONCAT44(extraout_var,iVar2) != 2)) {
        uVar3 = getWindowWidth();
        uVar4 = getWindowHeight();
        (*(pCVar5->super_Node)._vptr_Node[0x3e])(pCVar5,(ulong)uVar3,(ulong)uVar4);
        __fd = 2;
        (*(pCVar5->super_Node)._vptr_Node[0x39])();
        __addr = extraout_RDX_02;
      }
      Fbo::bind((Fbo *)quilt_fbo,__fd,__addr,__len);
    }
    if (cam._4_4_ == 0xffffffff) {
      glGetIntegerv(0xba2,&qs_viewHeight);
      viewIndex = (int)((float)(int)quilt / (float)DAT_007c4304);
      x = (int)((float)(int)DAT_007c4300 / (float)_DAT_007c4308);
      for (y = 0; y < DAT_007c430c; y = y + 1) {
        iVar6 = (y % DAT_007c4304) * viewIndex;
        iVar2 = (int)((float)y / (float)DAT_007c4304) * x;
        glViewport(iVar6,iVar2,viewIndex,x);
        glEnable(0xc11);
        glScissor(iVar6,iVar2,viewIndex,x);
        glm::vec<4,float,(glm::qualifier)0>::vec<int,int,int,int>
                  ((vec<4,float,(glm::qualifier)0> *)&vp_1.field_2,iVar6,iVar2,viewIndex,x);
        currentViewIndex = y;
        std::
        function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
        ::operator()((function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
                      *)this,(QuiltProperties *)&quilt,
                     (vec<4,_float,_(glm::qualifier)0> *)&vp_1.field_2,&y);
        glViewport(qs_viewHeight,qs_viewWidth,viewport[0],viewport[1]);
        glDisable(0xc11);
        glScissor(qs_viewHeight,qs_viewWidth,viewport[0],viewport[1]);
      }
    }
    else {
      currentViewIndex = cam._4_4_;
      iVar2 = getWindowWidth();
      iVar6 = getWindowHeight();
      glm::vec<4,float,(glm::qualifier)0>::vec<double,double,float,float>
                ((vec<4,float,(glm::qualifier)0> *)local_6c,0.0,0.0,(float)iVar2,(float)iVar6);
      std::
      function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
      ::operator()((function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
                    *)this,(QuiltProperties *)&quilt,(vec<4,_float,_(glm::qualifier)0> *)local_6c,
                   (int *)((long)&cam + 4));
    }
    if ((cam._3_1_ & 1) == 0) {
      Fbo::unbind((Fbo *)quilt_fbo);
      Shader::use((Shader *)quilt_shader);
      feedLenticularUniforms((Shader *)quilt_shader);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,"u_scene",&local_91);
      Shader::setUniformTexture((Shader *)quilt_shader,&local_90,(Fbo *)quilt_fbo,0);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,"u_resolution",&local_c9);
      iVar2 = getWindowWidth();
      iVar6 = getWindowHeight();
      Shader::setUniform((Shader *)quilt_shader,&local_c8,(float)iVar2,(float)iVar6);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f0,"u_modelViewProjectionMatrix",&local_f1);
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_134,1.0);
      Shader::setUniform((Shader *)quilt_shader,&local_f0,&local_134,false);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      this_00 = getBillboard();
      Vbo::render(this_00,(Shader *)quilt_shader);
    }
  }
  return;
}

Assistant:

void renderQuilt(std::function<void(const QuiltProperties&, glm::vec4&, int&)> _renderFnc, int _viewIndex, bool _justQuilt) {
    Camera* cam = getCamera();
    if (!cam)
        return;

    if (!_justQuilt) {

        if (!quilt_fbo.isAllocated())
            quilt_fbo.allocate(quilt.width, quilt.height, COLOR_TEXTURE_DEPTH_BUFFER);

        if (cam)
            if (cam->getProjectionType() != ProjectionType::PERSPECTIVE_VIRTUAL_OFFSET) {
                // cam->setAspect(1.0);
                cam->setViewport(getWindowWidth(),getWindowHeight());
                // cam->setFOV(glm::radians(14.0f));
                cam->setProjection(ProjectionType::PERSPECTIVE_VIRTUAL_OFFSET);
                // cam->setClipping(0.01, 100.0);
            }

        quilt_fbo.bind();
    }

    if (_viewIndex == -1) {
        // save the viewport for the total quilt
        GLint viewport[4];
        glGetIntegerv(GL_VIEWPORT, viewport);

        // get quilt view dimensions
        int qs_viewWidth = int(float(quilt.width) / float(quilt.columns));
        int qs_viewHeight = int(float(quilt.height) / float(quilt.rows));

        // render views and copy each view to the quilt
        for (int viewIndex = 0; viewIndex < quilt.totalViews; viewIndex++) {
            // get the x and y origin for this view
            int x = (viewIndex % quilt.columns) * qs_viewWidth;
            int y = int(float(viewIndex) / float(quilt.columns)) * qs_viewHeight;

            // get the x and y origin for this view
            // set the viewport to the view to control the projection extent
            glViewport(x, y, qs_viewWidth, qs_viewHeight);

            // // set the scissor to the view to restrict calls like glClear from making modifications
            glEnable(GL_SCISSOR_TEST);
            glScissor(x, y, qs_viewWidth, qs_viewHeight);
            glm::vec4 vp = glm::vec4(x, y, qs_viewWidth, qs_viewHeight);

            currentViewIndex = viewIndex;
            
            _renderFnc(quilt, vp, viewIndex);

            // reset viewport
            glViewport(viewport[0], viewport[1], viewport[2], viewport[3]);

            // // restore scissor
            glDisable(GL_SCISSOR_TEST);
            glScissor(viewport[0], viewport[1], viewport[2], viewport[3]);
        }

    }
    else {
        currentViewIndex = _viewIndex;
        glm::vec4 vp = glm::vec4(0.0, 0.0, float(vera::getWindowWidth()), float(vera::getWindowHeight()));
        _renderFnc(quilt, vp, _viewIndex);
    }

    if (!_justQuilt) {
        quilt_fbo.unbind();

        quilt_shader.use();
        feedLenticularUniforms( quilt_shader );
        quilt_shader.setUniformTexture("u_scene", &quilt_fbo, 0);
        quilt_shader.setUniform("u_resolution", float(vera::getWindowWidth()), float(vera::getWindowHeight()) );
        quilt_shader.setUniform("u_modelViewProjectionMatrix", glm::mat4(1.));
        vera::getBillboard()->render( &quilt_shader );
    }
}